

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_dbg.c
# Opt level: O3

ecs_type_t ecs_dbg_get_column_type(ecs_world_t *world,ecs_entity_t system,int32_t column_index)

{
  int32_t iVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  ecs_type_t peVar5;
  
  pvVar2 = ecs_get_w_entity(world,system,5);
  if (pvVar2 != (void *)0x0) {
    pvVar3 = _ecs_vector_first(*(ecs_vector_t **)(*(long *)((long)pvVar2 + 0x18) + 0x10),0x28,0x10);
    iVar1 = ecs_vector_count(*(ecs_vector_t **)(*(long *)((long)pvVar2 + 0x18) + 0x10));
    if (column_index <= iVar1) {
      lVar4 = (long)column_index;
      if (*(int *)((long)pvVar3 + lVar4 * 0x28 + -0x24) == 1) {
        return *(ecs_type_t *)((long)pvVar3 + lVar4 * 0x28 + -0x18);
      }
      peVar5 = ecs_type_from_entity(world,*(ecs_entity_t *)((long)pvVar3 + lVar4 * 0x28 + -0x18));
      return peVar5;
    }
  }
  return (ecs_type_t)0x0;
}

Assistant:

ecs_type_t ecs_dbg_get_column_type(
    ecs_world_t *world,
    ecs_entity_t system,
    int32_t column_index)
{
    const EcsSystem *system_data = ecs_get(world, system, EcsSystem);
    if (!system_data) {
        return NULL;
    }
    
    ecs_sig_column_t *columns = ecs_vector_first(
        system_data->query->sig.columns, ecs_sig_column_t);
    int32_t count = ecs_vector_count(system_data->query->sig.columns);

    if (count < column_index) {
        return NULL;
    }

    ecs_sig_column_t *column = &columns[column_index - 1];
    ecs_sig_oper_kind_t oper_kind = column->oper_kind;
    ecs_type_t result;

    switch(oper_kind) {
    case EcsOperOr:
        result = column->is.type;
        break;
    default:
        result = ecs_type_from_entity(world, column->is.component);
        break;
    }
    
    return result;
}